

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

FxExpression * FxConstant::MakeConstant(PSymbol *sym,FScriptPosition *pos)

{
  anon_union_8_3_e9694d7a_for_PSymbolConstNumeric_3 aVar1;
  PType *pPVar2;
  PClass *pPVar3;
  PClass *pPVar4;
  PInt *pPVar5;
  PFloat *pPVar6;
  int iVar7;
  PSymbolConstNumeric *pPVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxExpression *this;
  char *pcVar9;
  char *message;
  
  pPVar8 = dyn_cast<PSymbolConstNumeric>(&sym->super_DObject);
  pPVar3 = PInt::RegistrationInfo.MyClass;
  if (pPVar8 == (PSymbolConstNumeric *)0x0) {
    pcVar9 = FName::NameData.NameArray[*(int *)&(sym->super_DObject).field_0x24].Text;
    message = "\'%s\' is not a constant\n";
LAB_00665401:
    this = (FxExpression *)0x0;
    FScriptPosition::Message(pos,2,message,pcVar9);
  }
  else {
    pPVar2 = (pPVar8->super_PSymbolConst).ValueType;
    if ((pPVar2->super_DObject).Class == (PClass *)0x0) {
      iVar7 = (**(pPVar2->super_DObject)._vptr_DObject)(pPVar2);
      (pPVar2->super_DObject).Class = (PClass *)CONCAT44(extraout_var,iVar7);
    }
    pPVar4 = PFloat::RegistrationInfo.MyClass;
    if ((pPVar2->super_DObject).Class == pPVar3) {
      this = (FxExpression *)operator_new(0x48);
      iVar7 = (pPVar8->field_0).Value;
      FxExpression::FxExpression(this,pos);
      this->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_008682d0;
      pPVar5 = TypeSInt32;
      this[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
      this->ValueType = (PType *)pPVar5;
      *(int *)&this[1].JumpAddresses.Array = iVar7;
    }
    else {
      pPVar2 = (pPVar8->super_PSymbolConst).ValueType;
      if ((pPVar2->super_DObject).Class == (PClass *)0x0) {
        iVar7 = (**(pPVar2->super_DObject)._vptr_DObject)(pPVar2);
        (pPVar2->super_DObject).Class = (PClass *)CONCAT44(extraout_var_00,iVar7);
      }
      if ((pPVar2->super_DObject).Class != pPVar4) {
        pcVar9 = FName::NameData.NameArray
                 [*(int *)&(pPVar8->super_PSymbolConst).super_PSymbol.super_DObject.field_0x24].Text
        ;
        message = "Invalid constant \'%s\'\n";
        goto LAB_00665401;
      }
      this = (FxExpression *)operator_new(0x48);
      aVar1 = pPVar8->field_0;
      FxExpression::FxExpression(this,pos);
      this->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_008682d0;
      this[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
      *(undefined4 *)&this[1].JumpAddresses.Array = 0;
      pPVar6 = TypeFloat64;
      this[1]._vptr_FxExpression = (_func_int **)TypeFloat64;
      this->ValueType = (PType *)pPVar6;
      this[1].JumpAddresses.Array = (FxJumpStatement **)aVar1;
    }
    this->isresolved = true;
  }
  return this;
}

Assistant:

FxExpression *FxConstant::MakeConstant(PSymbol *sym, const FScriptPosition &pos)
{
	FxExpression *x;
	PSymbolConstNumeric *csym = dyn_cast<PSymbolConstNumeric>(sym);
	if (csym != NULL)
	{
		if (csym->ValueType->IsA(RUNTIME_CLASS(PInt)))
		{
			x = new FxConstant(csym->Value, pos);
		}
		else if (csym->ValueType->IsA(RUNTIME_CLASS(PFloat)))
		{
			x = new FxConstant(csym->Float, pos);
		}
		else
		{
			pos.Message(MSG_ERROR, "Invalid constant '%s'\n", csym->SymbolName.GetChars());
			return NULL;
		}
	}
	else
	{
		pos.Message(MSG_ERROR, "'%s' is not a constant\n", sym->SymbolName.GetChars());
		x = NULL;
	}
	return x;
}